

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_doing(Curl_easy *data,_Bool *dophase_done)

{
  CURLcode local_1c;
  CURLcode result;
  _Bool *dophase_done_local;
  Curl_easy *data_local;
  
  local_1c = smtp_multi_statemach(data,dophase_done);
  if ((local_1c == CURLE_OK) && ((*dophase_done & 1U) != 0)) {
    local_1c = smtp_dophase_done(data,false);
  }
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     (0 < Curl_trc_feat_smtp.log_level)) {
    Curl_trc_smtp(data,"smtp_doing() -> %d, done=%d",(ulong)local_1c,(ulong)(*dophase_done & 1));
  }
  return local_1c;
}

Assistant:

static CURLcode smtp_doing(struct Curl_easy *data, bool *dophase_done)
{
  CURLcode result = smtp_multi_statemach(data, dophase_done);

  if(result)
    DEBUGF(infof(data, "DO phase failed"));
  else if(*dophase_done) {
    result = smtp_dophase_done(data, FALSE /* not connected */);

    DEBUGF(infof(data, "DO phase is complete"));
  }

  CURL_TRC_SMTP(data, "smtp_doing() -> %d, done=%d", result, *dophase_done);
  return result;
}